

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O0

float _computeNumberOperation<float,float>(TokenType type,float x,float y)

{
  allocator<char> local_39;
  string local_38;
  float local_18;
  float local_14;
  float y_local;
  float x_local;
  TokenType type_local;
  
  switch(type) {
  case TOK_OP_ADD:
    x_local = x + y;
    break;
  case TOK_OP_SUB:
    x_local = x - y;
    break;
  default:
    local_18 = y;
    local_14 = x;
    y_local._2_2_ = type;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unknown operation",&local_39);
    pfederc::fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_optimizer.cpp"
                   ,0x8b,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    x_local = 0.0;
    break;
  case TOK_OP_MUL:
    x_local = x * y;
    break;
  case TOK_OP_DIV:
    x_local = x / y;
  }
  return x_local;
}

Assistant:

static R _computeNumberOperation(TokenType type, T x, T y) noexcept {
	switch (type) {
	case TokenType::TOK_OP_ADD:
		return static_cast<R>(x + y);
  case TokenType::TOK_OP_SUB:
		return static_cast<R>(x - y);
  case TokenType::TOK_OP_MUL:
		return static_cast<R>(x * y);
  case TokenType::TOK_OP_DIV:
		return static_cast<R>(x / y);
	default:
		fatal(__FILE__, __LINE__, "Unknown operation");
		return 0;
	}
}